

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomposition.hpp
# Opt level: O0

Coordinate
diy::detail::BoundsHelper<diy::Bounds<int>,_void>::to
          (int i,int n,Coordinate min,Coordinate max,bool shared_face)

{
  Coordinate in_ECX;
  Coordinate in_EDX;
  int in_ESI;
  int in_EDI;
  byte in_R8B;
  int local_4;
  
  local_4 = in_ECX;
  if (in_EDI != in_ESI + -1) {
    local_4 = from(in_EDI + 1,in_ESI,in_EDX,in_ECX,(bool)(in_R8B & 1));
    local_4 = local_4 - (uint)((bool)(in_R8B & 1) == false);
  }
  return local_4;
}

Assistant:

static Coordinate   to  (int i, int n, Coordinate min, Coordinate max, bool shared_face)
    {
      if (i == n - 1)
        return max;
      else
        return from(i+1, n, min, max, shared_face) - (shared_face ? 0 : 1);
    }